

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileImporter.cpp
# Opt level: O2

void __thiscall
Assimp::XFileImporter::ConvertMaterials
          (XFileImporter *this,aiScene *pScene,
          vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_> *pMaterials)

{
  pointer pMVar1;
  char cVar2;
  pointer pMVar3;
  aiMaterial **__src;
  _Alloc_hider _Var4;
  aiMaterial **__dest;
  aiMaterial *this_00;
  long lVar5;
  long lVar6;
  Logger *this_01;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  int iVar10;
  uint uVar11;
  uint index;
  long lVar12;
  pointer pTVar13;
  uint local_89c;
  uint local_898;
  uint local_894;
  uint local_890;
  uint local_88c;
  int shadeMode;
  aiScene *local_880;
  vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_> *local_878;
  ulong local_870;
  long local_868;
  string sz;
  aiString name;
  aiString tex;
  
  pMVar3 = (pMaterials->
           super__Vector_base<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>).
           _M_impl.super__Vector_impl_data._M_start;
  iVar10 = 0;
  for (uVar7 = 0;
      (ulong)uVar7 <
      (ulong)(((long)(pMaterials->
                     super__Vector_base<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar3) / 0x70);
      uVar7 = uVar7 + 1) {
    iVar10 = iVar10 + (pMVar3[uVar7].mIsReference ^ 1);
  }
  if (iVar10 != 0) {
    __src = pScene->mMaterials;
    uVar7 = pScene->mNumMaterials;
    __dest = (aiMaterial **)operator_new__((ulong)(iVar10 + uVar7) << 3);
    pScene->mMaterials = __dest;
    if (__src != (aiMaterial **)0x0) {
      memcpy(__dest,__src,(ulong)uVar7 << 3);
      operator_delete__(__src);
    }
  }
  uVar7 = 0;
  local_880 = pScene;
  local_878 = pMaterials;
  do {
    local_870 = (ulong)uVar7;
    pMVar3 = (pMaterials->
             super__Vector_base<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(pMaterials->
                       super__Vector_base<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar3) / 0x70) <=
        local_870) {
      return;
    }
    pMVar1 = pMVar3 + local_870;
    if (pMVar3[local_870].mIsReference == true) {
      for (uVar8 = 0; uVar8 < pScene->mNumMaterials; uVar8 = uVar8 + 1) {
        name.length = 0;
        name.data[0] = '\0';
        memset(name.data + 1,0x1b,0x3ff);
        aiGetMaterialString(pScene->mMaterials[uVar8],"?mat.name",0,0,&name);
        iVar10 = strcmp(name.data,(pMVar1->mName)._M_dataplus._M_p);
        if (iVar10 == 0) {
          pMVar1->sceneIndex = uVar8;
          break;
        }
      }
      if (pMVar1->sceneIndex == 0xffffffffffffffff) {
        this_01 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[46]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                   (char (*) [46])"Could not resolve global material reference \"");
        std::operator<<((ostream *)&name,(string *)pMVar1);
        std::operator<<((ostream *)&name,"\"");
        std::__cxx11::stringbuf::str();
        Logger::warn(this_01,(char *)CONCAT44(tex.data._0_4_,tex.length));
        std::__cxx11::string::~string((string *)&tex);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        pMVar1->sceneIndex = 0;
      }
    }
    else {
      this_00 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_00);
      name.length = 0;
      name.data[0] = '\0';
      memset(name.data + 1,0x1b,0x3ff);
      uVar8 = (pMVar1->mName)._M_string_length;
      if (uVar8 < 0x400) {
        name.length = (ai_uint32)uVar8;
        memcpy(name.data,(pMVar1->mName)._M_dataplus._M_p,uVar8);
        name.data[uVar8] = '\0';
      }
      aiMaterial::AddProperty(this_00,&name,"?mat.name",0,0);
      shadeMode = 3 - (uint)((int)pMVar1->mSpecularExponent == 0);
      aiMaterial::AddProperty<int>(this_00,&shadeMode,1,"$mat.shadingm",0,0);
      aiMaterial::AddProperty(this_00,&pMVar1->mEmissive,1,"$clr.emissive",0,0);
      aiMaterial::AddProperty(this_00,&pMVar1->mDiffuse,1,"$clr.diffuse",0,0);
      aiMaterial::AddProperty(this_00,&pMVar1->mSpecular,1,"$clr.specular",0,0);
      aiMaterial::AddProperty(this_00,&pMVar1->mSpecularExponent,1,"$mat.shininess",0,0);
      lVar6 = *(long *)&(pMVar1->mTextures).
                        super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>
                        ._M_impl;
      pTVar13 = *(pointer *)
                 ((long)&(pMVar1->mTextures).
                         super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>
                         ._M_impl + 8);
      if ((long)pTVar13 - lVar6 == 0x28) {
        uVar8 = pTVar13[-1].mName._M_string_length;
        if (uVar8 != 0) {
          sVar9 = uVar8 & 0xffffffff;
          if ((uVar8 & 0xfffffc00) != 0) {
            sVar9 = 0x3ff;
          }
          tex.length = (ai_uint32)sVar9;
          memcpy(tex.data,pTVar13[-1].mName._M_dataplus._M_p,sVar9);
          tex.data[sVar9] = '\0';
          aiMaterial::AddProperty
                    (this_00,&tex,"$tex.file",
                     (uint)pTVar13[-1].mIsNormalMap + (uint)pTVar13[-1].mIsNormalMap * 4 + 1,0);
        }
      }
      else {
        index = 0;
        local_88c = 0;
        local_89c = 0;
        local_890 = 0;
        local_894 = 0;
        local_898 = 0;
        uVar7 = 0;
        while( true ) {
          if ((ulong)(((long)pTVar13 - lVar6) / 0x28) <= (ulong)uVar7) break;
          lVar12 = (ulong)uVar7 * 0x28;
          std::__cxx11::string::string((string *)&sz,(string *)(lVar6 + lVar12));
          if (sz._M_string_length != 0) {
            lVar5 = std::__cxx11::string::find_last_of((char *)&sz,0x5fcb96);
            local_868 = 0;
            if (lVar5 != -1) {
              local_868 = lVar5;
            }
            lVar5 = std::__cxx11::string::rfind((char)&sz,0x2e);
            if (lVar5 != -1) {
              sz._M_dataplus._M_p[lVar5] = '\0';
            }
            for (uVar11 = 0; _Var4._M_p = sz._M_dataplus._M_p, uVar8 = (ulong)uVar11,
                uVar8 < sz._M_string_length; uVar11 = uVar11 + 1) {
              cVar2 = sz._M_dataplus._M_p[uVar8];
              iVar10 = isalpha((int)cVar2);
              if (iVar10 != 0) {
                iVar10 = tolower((int)cVar2);
                _Var4._M_p[uVar8] = (char)iVar10;
              }
            }
            lVar5 = *(long *)&(pMVar1->mTextures).
                              super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>
                              ._M_impl;
            uVar8 = *(ulong *)(lVar5 + 8 + lVar12);
            sVar9 = uVar8 & 0xffffffff;
            if ((uVar8 & 0xfffffc00) != 0) {
              sVar9 = 0x3ff;
            }
            tex.length = (ai_uint32)sVar9;
            memcpy(tex.data,*(void **)(lVar5 + lVar12),sVar9);
            tex.data[sVar9] = '\0';
            lVar5 = std::__cxx11::string::find((char *)&sz,0x647904);
            if ((lVar5 == -1) &&
               (lVar5 = std::__cxx11::string::find((char *)&sz,0x5d7a40), lVar5 == -1)) {
              if ((((string *)(lVar6 + lVar12))[0x20] == (string)0x0) &&
                 ((lVar6 = std::__cxx11::string::find((char *)&sz,0x610546), lVar6 == -1 &&
                  (lVar6 = std::__cxx11::string::find((char *)&sz,0x638484), lVar6 == -1)))) {
                lVar6 = std::__cxx11::string::find((char *)&sz,0x61458a);
                if ((lVar6 == -1) &&
                   (lVar6 = std::__cxx11::string::find((char *)&sz,0x638487), lVar6 == -1)) {
                  lVar6 = std::__cxx11::string::find((char *)&sz,0x63848d);
                  if ((lVar6 == -1) &&
                     (lVar6 = std::__cxx11::string::find((char *)&sz,0x638492), lVar6 == -1)) {
                    lVar6 = std::__cxx11::string::find((char *)&sz,0x602505);
                    if ((lVar6 == -1) &&
                       (lVar6 = std::__cxx11::string::find((char *)&sz,0x638496), lVar6 == -1)) {
                      aiMaterial::AddProperty(this_00,&tex,"$tex.file",1,local_89c);
                      local_89c = local_89c + 1;
                    }
                    else {
                      aiMaterial::AddProperty(this_00,&tex,"$tex.file",4,local_898);
                      local_898 = local_898 + 1;
                    }
                  }
                  else {
                    aiMaterial::AddProperty(this_00,&tex,"$tex.file",3,local_894);
                    local_894 = local_894 + 1;
                  }
                }
                else {
                  aiMaterial::AddProperty(this_00,&tex,"$tex.file",2,local_890);
                  local_890 = local_890 + 1;
                }
              }
              else {
                aiMaterial::AddProperty(this_00,&tex,"$tex.file",6,local_88c);
                local_88c = local_88c + 1;
              }
            }
            else {
              aiMaterial::AddProperty(this_00,&tex,"$tex.file",5,index);
              index = index + 1;
            }
          }
          std::__cxx11::string::~string((string *)&sz);
          uVar7 = uVar7 + 1;
          lVar6 = *(long *)&(pMVar1->mTextures).
                            super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>
                            ._M_impl;
          pTVar13 = *(pointer *)
                     ((long)&(pMVar1->mTextures).
                             super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>
                             ._M_impl + 8);
        }
      }
      local_880->mMaterials[local_880->mNumMaterials] = this_00;
      pMVar1->sceneIndex = (ulong)local_880->mNumMaterials;
      local_880->mNumMaterials = local_880->mNumMaterials + 1;
      pScene = local_880;
      pMaterials = local_878;
    }
    uVar7 = (int)local_870 + 1;
  } while( true );
}

Assistant:

void XFileImporter::ConvertMaterials( aiScene* pScene, std::vector<XFile::Material>& pMaterials)
{
    // count the non-referrer materials in the array
    unsigned int numNewMaterials( 0 );
    for ( unsigned int a = 0; a < pMaterials.size(); ++a ) {
        if ( !pMaterials[ a ].mIsReference ) {
            ++numNewMaterials;
        }
    }

    // resize the scene's material list to offer enough space for the new materials
    if( numNewMaterials > 0 ) {
        aiMaterial** prevMats = pScene->mMaterials;
        pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials + numNewMaterials];
        if( nullptr != prevMats)  {
            ::memcpy( pScene->mMaterials, prevMats, pScene->mNumMaterials * sizeof( aiMaterial*));
            delete [] prevMats;
        }
    }

    // convert all the materials given in the array
    for( unsigned int a = 0; a < pMaterials.size(); ++a ) {
        XFile::Material& oldMat = pMaterials[a];
        if( oldMat.mIsReference) {
            // find the material it refers to by name, and store its index
            for( size_t a = 0; a < pScene->mNumMaterials; ++a ) {
                aiString name;
                pScene->mMaterials[a]->Get( AI_MATKEY_NAME, name);
                if( strcmp( name.C_Str(), oldMat.mName.data()) == 0 ) {
                    oldMat.sceneIndex = a;
                    break;
                }
            }

            if( oldMat.sceneIndex == SIZE_MAX ) {
                ASSIMP_LOG_WARN_F( "Could not resolve global material reference \"", oldMat.mName, "\"" );
                oldMat.sceneIndex = 0;
            }

            continue;
        }

        aiMaterial* mat = new aiMaterial;
        aiString name;
        name.Set( oldMat.mName);
        mat->AddProperty( &name, AI_MATKEY_NAME);

        // Shading model: hard-coded to PHONG, there is no such information in an XFile
        // FIX (aramis): If the specular exponent is 0, use gouraud shading. This is a bugfix
        // for some models in the SDK (e.g. good old tiny.x)
        int shadeMode = (int)oldMat.mSpecularExponent == 0.0f
            ? aiShadingMode_Gouraud : aiShadingMode_Phong;

        mat->AddProperty<int>( &shadeMode, 1, AI_MATKEY_SHADING_MODEL);
        // material colours
        // Unclear: there's no ambient colour, but emissive. What to put for ambient?
        // Probably nothing at all, let the user select a suitable default.
        mat->AddProperty( &oldMat.mEmissive, 1, AI_MATKEY_COLOR_EMISSIVE);
        mat->AddProperty( &oldMat.mDiffuse, 1, AI_MATKEY_COLOR_DIFFUSE);
        mat->AddProperty( &oldMat.mSpecular, 1, AI_MATKEY_COLOR_SPECULAR);
        mat->AddProperty( &oldMat.mSpecularExponent, 1, AI_MATKEY_SHININESS);


        // texture, if there is one
        if (1 == oldMat.mTextures.size() ) {
            const XFile::TexEntry& otex = oldMat.mTextures.back();
            if (otex.mName.length()) {
                // if there is only one texture assume it contains the diffuse color
                aiString tex( otex.mName);
                if ( otex.mIsNormalMap ) {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_NORMALS( 0 ) );
                } else {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_DIFFUSE( 0 ) );
                }
            }
        } else {
            // Otherwise ... try to search for typical strings in the
            // texture's file name like 'bump' or 'diffuse'
            unsigned int iHM = 0,iNM = 0,iDM = 0,iSM = 0,iAM = 0,iEM = 0;
            for( unsigned int b = 0; b < oldMat.mTextures.size(); ++b ) {
                const XFile::TexEntry& otex = oldMat.mTextures[b];
                std::string sz = otex.mName;
                if ( !sz.length() ) {
                    continue;
                }

                // find the file name
                std::string::size_type s = sz.find_last_of("\\/");
                if ( std::string::npos == s ) {
                    s = 0;
                }

                // cut off the file extension
                std::string::size_type sExt = sz.find_last_of('.');
                if (std::string::npos != sExt){
                    sz[sExt] = '\0';
                }

                // convert to lower case for easier comparison
                for ( unsigned int c = 0; c < sz.length(); ++c ) {
                    if ( isalpha( sz[ c ] ) ) {
                        sz[ c ] = tolower( sz[ c ] );
                    }
                }

                // Place texture filename property under the corresponding name
                aiString tex( oldMat.mTextures[b].mName);

                // bump map
                if (std::string::npos != sz.find("bump", s) || std::string::npos != sz.find("height", s)) {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_HEIGHT(iHM++));
                } else if (otex.mIsNormalMap || std::string::npos != sz.find( "normal", s) || std::string::npos != sz.find("nm", s)) {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_NORMALS(iNM++));
                } else if (std::string::npos != sz.find( "spec", s) || std::string::npos != sz.find( "glanz", s)) {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_SPECULAR(iSM++));
                } else if (std::string::npos != sz.find( "ambi", s) || std::string::npos != sz.find( "env", s)) {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_AMBIENT(iAM++));
                } else if (std::string::npos != sz.find( "emissive", s) || std::string::npos != sz.find( "self", s)) {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_EMISSIVE(iEM++));
                } else {
                    // Assume it is a diffuse texture
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_DIFFUSE(iDM++));
                }
            }
        }

        pScene->mMaterials[pScene->mNumMaterials] = mat;
        oldMat.sceneIndex = pScene->mNumMaterials;
        pScene->mNumMaterials++;
    }
}